

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

int __thiscall
QAccessibleMdiArea::indexOfChild(QAccessibleMdiArea *this,QAccessibleInterface *child)

{
  long lVar1;
  QMdiArea *pQVar2;
  QObject *object;
  qsizetype qVar3;
  int iVar4;
  long in_FS_OFFSET;
  QMdiSubWindow *window;
  QArrayDataPointer<QMdiSubWindow_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = -1;
  if (child != (QAccessibleInterface *)0x0) {
    lVar1 = (**(code **)(*(long *)child + 0x18))(child);
    if (lVar1 != 0) {
      pQVar2 = (QMdiArea *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      QMdiArea::subWindowList((QList<QMdiSubWindow_*> *)&local_48,pQVar2,CreationOrder);
      QArrayDataPointer<QMdiSubWindow_*>::~QArrayDataPointer(&local_48);
      if (local_48.size != 0) {
        object = (QObject *)(**(code **)(*(long *)child + 0x18))(child);
        window = QtPrivate::qobject_cast_helper<QMdiSubWindow*,QObject>(object);
        if (window == (QMdiSubWindow *)0x0) {
          iVar4 = -1;
        }
        else {
          pQVar2 = (QMdiArea *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
          QMdiArea::subWindowList((QList<QMdiSubWindow_*> *)&local_48,pQVar2,CreationOrder);
          qVar3 = QtPrivate::indexOf<QMdiSubWindow*,QMdiSubWindow*>
                            ((QList<QMdiSubWindow_*> *)&local_48,&window,0);
          iVar4 = (int)qVar3;
          QArrayDataPointer<QMdiSubWindow_*>::~QArrayDataPointer(&local_48);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleMdiArea::indexOfChild(const QAccessibleInterface *child) const
{
    if (!child || !child->object() || mdiArea()->subWindowList().isEmpty())
        return -1;
    if (QMdiSubWindow *window = qobject_cast<QMdiSubWindow *>(child->object())) {
        return mdiArea()->subWindowList().indexOf(window);
    }
    return -1;
}